

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort *puVar9;
  char *__dest;
  ushort *puVar10;
  char cVar11;
  BYTE *d_1;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  BYTE *d_2;
  size_t __n;
  char *pcVar16;
  char *pcVar17;
  long lStack_70;
  int local_60;
  int local_50;
  
  puVar10 = (ushort *)0xffffffffffffffff;
  iVar14 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar10 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pcVar3 = dest + (uint)maxOutputSize;
      pcVar1 = pcVar3 + -7;
      puVar10 = (ushort *)source;
      __dest = dest;
LAB_00103753:
      do {
        puVar9 = (ushort *)((long)puVar10 + 1);
        bVar4 = (byte)*puVar10;
        __n = (size_t)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          lStack_70 = -1;
          if (puVar9 < pbVar2 + -0xf) {
            lStack_70 = 0;
            puVar10 = puVar10 + 1;
            do {
              puVar9 = puVar10;
              if (pbVar2 + -0xf < puVar9) {
                lStack_70 = -1;
                break;
              }
              lStack_70 = lStack_70 + (ulong)*(byte *)((long)puVar9 + -1);
              puVar10 = (ushort *)((long)puVar9 + 1);
            } while ((ulong)*(byte *)((long)puVar9 + -1) == 0xff);
          }
          puVar10 = puVar9;
          cVar11 = '\x05';
          __n = 0xf;
          if ((lStack_70 != -1) && (__n = lStack_70 + 0xf, !CARRY8((ulong)__dest,__n))) {
            cVar11 = CARRY8((ulong)puVar10,__n) * '\x05';
          }
          puVar9 = puVar10;
          if (cVar11 != '\0') {
            if (cVar11 != '\x05') goto LAB_00103a0e;
            goto LAB_00103a08;
          }
LAB_001037cb:
          puVar10 = puVar9;
          pcVar12 = __dest + __n;
          if ((pcVar3 + -0xc < pcVar12) ||
             (puVar9 = (ushort *)((long)puVar10 + __n), pbVar2 + -8 < puVar9)) {
            if (((byte *)((long)puVar10 + __n) != pbVar2) || (pcVar3 < pcVar12)) goto LAB_00103a08;
            memmove(__dest,puVar10,__n);
            local_50 = (int)dest;
            puVar10 = (ushort *)(ulong)(uint)((int)pcVar12 - local_50);
            goto LAB_00103a0e;
          }
          do {
            *(undefined8 *)__dest = *(undefined8 *)puVar10;
            __dest = __dest + 8;
            puVar10 = puVar10 + 4;
          } while (__dest < pcVar12);
          uVar5 = *puVar9;
          puVar10 = puVar9 + 1;
          pcVar16 = pcVar12 + -(ulong)uVar5;
          uVar15 = (ulong)(bVar4 & 0xf);
        }
        else {
          if ((source + (long)compressedSize + -0x10 <= puVar9) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < __dest)) goto LAB_001037cb;
          uVar7 = *(undefined8 *)((long)puVar10 + 9);
          *(undefined8 *)__dest = *(undefined8 *)puVar9;
          *(undefined8 *)(__dest + 8) = uVar7;
          pcVar12 = __dest + __n;
          uVar15 = (ulong)(bVar4 & 0xf);
          puVar10 = (ushort *)((long)puVar9 + __n) + 1;
          uVar5 = *(ushort *)((long)puVar9 + __n);
          pcVar16 = pcVar12 + -(ulong)uVar5;
          if ((uVar15 != 0xf) && ((7 < uVar5 && (dest + -prefixSize <= pcVar16)))) {
            *(undefined8 *)pcVar12 = *(undefined8 *)pcVar16;
            *(undefined8 *)(pcVar12 + 8) = *(undefined8 *)(pcVar16 + 8);
            *(undefined2 *)(pcVar12 + 0x10) = *(undefined2 *)(pcVar16 + 0x10);
            __dest = pcVar12 + uVar15 + 4;
            goto LAB_00103753;
          }
        }
        if ((int)uVar15 == 0xf) {
          lStack_70 = 0;
          puVar9 = puVar10;
          do {
            puVar10 = (ushort *)((long)puVar9 + 1);
            if (pbVar2 + -4 < puVar10) {
              lStack_70 = -1;
              break;
            }
            uVar8 = *puVar9;
            lStack_70 = lStack_70 + (ulong)(byte)uVar8;
            puVar9 = puVar10;
          } while ((ulong)(byte)uVar8 == 0xff);
          uVar15 = lStack_70 + 0xf;
          if ((lStack_70 == -1) || (CARRY8((ulong)pcVar12,uVar15))) goto LAB_00103a08;
        }
        if (pcVar16 < dest + -prefixSize) goto LAB_00103a08;
        if (uVar5 < 8) {
          pcVar12[0] = '\0';
          pcVar12[1] = '\0';
          pcVar12[2] = '\0';
          pcVar12[3] = '\0';
          *pcVar12 = *pcVar16;
          pcVar12[1] = pcVar16[1];
          pcVar12[2] = pcVar16[2];
          pcVar12[3] = pcVar16[3];
          uVar6 = inc32table[uVar5];
          *(undefined4 *)(pcVar12 + 4) = *(undefined4 *)(pcVar16 + uVar6);
          pcVar16 = pcVar16 + ((ulong)uVar6 - (long)dec64table[uVar5]);
        }
        else {
          *(undefined8 *)pcVar12 = *(undefined8 *)pcVar16;
          pcVar16 = pcVar16 + 8;
        }
        __dest = pcVar12 + uVar15 + 4;
        pcVar13 = pcVar12 + 8;
        if (__dest <= pcVar3 + -0xc) {
          *(undefined8 *)pcVar13 = *(undefined8 *)pcVar16;
          if (0x10 < uVar15 + 4) {
            pcVar12 = pcVar12 + 0x10;
            do {
              pcVar16 = pcVar16 + 8;
              *(undefined8 *)pcVar12 = *(undefined8 *)pcVar16;
              pcVar12 = pcVar12 + 8;
            } while (pcVar12 < __dest);
          }
          goto LAB_00103753;
        }
        iVar14 = 5;
        if (__dest <= pcVar3 + -5) {
          pcVar12 = pcVar16;
          pcVar17 = pcVar13;
          if (pcVar13 < pcVar1) {
            do {
              *(undefined8 *)pcVar17 = *(undefined8 *)pcVar12;
              pcVar17 = pcVar17 + 8;
              pcVar12 = pcVar12 + 8;
            } while (pcVar17 < pcVar1);
            pcVar16 = pcVar16 + ((long)pcVar1 - (long)pcVar13);
            pcVar13 = pcVar1;
          }
          iVar14 = 0;
          for (; pcVar13 < __dest; pcVar13 = pcVar13 + 1) {
            cVar11 = *pcVar16;
            pcVar16 = pcVar16 + 1;
            *pcVar13 = cVar11;
          }
        }
      } while (iVar14 == 0);
      if (iVar14 == 5) {
LAB_00103a08:
        local_60 = (int)source;
        puVar10 = (ushort *)(ulong)(~(uint)puVar10 + local_60);
      }
    }
LAB_00103a0e:
    iVar14 = (int)puVar10;
  }
  return iVar14;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}